

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::coap::Message::Serialize
          (Error *__return_storage_ptr__,Message *this,OptionType aOptionNumber,
          OptionValue *aOptionValue,uint16_t aLastOptionNumber,ByteArray *aBuf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer puVar3;
  uint uVar4;
  bool bVar5;
  char *pcVar6;
  pointer puVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  ushort uVar11;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar12;
  ulong uVar13;
  byte bVar14;
  long lVar15;
  Error *pEVar16;
  string_view fmt;
  format_args args;
  OptionType local_ca;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  string *local_c0;
  Error *local_b8;
  string local_b0;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  format_string_checker<char> local_68;
  
  __return_storage_ptr__->mCode = kNone;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  uVar11 = aOptionNumber - aLastOptionNumber;
  local_ca = aOptionNumber;
  if (aLastOptionNumber <= aOptionNumber) {
    lVar15 = (long)(aOptionValue->mValue).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(aOptionValue->mValue).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_c0 = (string *)&__return_storage_ptr__->mMessage;
    puVar2 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    aVar12 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )aBuf;
    local_b8 = __return_storage_ptr__;
    bVar5 = IsValidOption(aOptionNumber,aOptionValue);
    pEVar16 = local_b8;
    if (bVar5) {
      uVar4 = (uint)lVar15;
      uVar10 = uVar4 & 0xffff;
      lVar9 = 0;
      if (0xc < uVar10) {
        lVar9 = (ulong)(uVar10 != 0xd) + 1;
      }
      uVar13 = 1;
      if (0xc < uVar11) {
        uVar13 = (ulong)(uVar11 == 0xd) ^ 3;
      }
      local_c8 = paVar1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (aBuf,(size_type)(puVar2 + lVar9 + (uVar13 - (long)puVar3)));
      pEVar16 = local_b8;
      if (uVar11 < 0xd) {
        puVar7 = puVar2 + (1 - (long)puVar3);
        puVar2[(long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start - (long)puVar3] = (char)uVar11 << 4;
      }
      else {
        puVar7 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (uVar11 < 0x10d) {
          puVar2[(long)puVar7 - (long)puVar3] = puVar2[(long)puVar7 - (long)puVar3] | 0xd0;
          puVar7 = puVar2 + (2 - (long)puVar3);
          puVar2[(long)((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start + (1 - (long)puVar3))] =
               (char)uVar11 + 0xf3;
        }
        else {
          puVar2[(long)puVar7 - (long)puVar3] = puVar2[(long)puVar7 - (long)puVar3] | 0xe0;
          puVar2[(long)((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start + (1 - (long)puVar3))] =
               (uchar)(uVar11 - 0x10d >> 8);
          puVar7 = puVar2 + (3 - (long)puVar3);
          puVar2[(long)((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start + (2 - (long)puVar3))] =
               (uchar)(uVar11 - 0x10d);
        }
      }
      bVar14 = (byte)lVar15;
      if (uVar10 < 0xd) {
        puVar2[(long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start - (long)puVar3] =
             puVar2[(long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                          _M_impl.super__Vector_impl_data._M_start - (long)puVar3] | bVar14;
      }
      else if (uVar10 < 0x10d) {
        puVar2[(long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start - (long)puVar3] =
             puVar2[(long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                          _M_impl.super__Vector_impl_data._M_start - (long)puVar3] | 0xd;
        puVar7[(long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start] = bVar14 - 0xd;
        puVar7 = puVar7 + 1;
      }
      else {
        iVar8 = uVar4 + 0xfef3;
        puVar2[(long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start - (long)puVar3] =
             puVar2[(long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                          _M_impl.super__Vector_impl_data._M_start - (long)puVar3] | 0xe;
        puVar7[(long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start] = (uchar)((uint)iVar8 >> 8);
        puVar7[(long)((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start + 1)] = (uchar)iVar8;
        puVar7 = puVar7 + 2;
      }
      if (puVar2 + lVar9 + (uVar13 - (long)puVar3) != puVar7) goto LAB_001d380b;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf,
                 (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (aOptionValue->mValue).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (aOptionValue->mValue).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    else {
      local_68.types_[0] = custom_type;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "option {} is not valid";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x16;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
      local_68.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<ot::commissioner::coap::OptionType,fmt::v10::detail::compile_parse_context<char>>
      ;
      begin = "option {} is not valid";
      local_68.context_.types_ = local_68.types_;
      do {
        pcVar6 = begin + 1;
        if (*begin == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = begin + 2;
        }
        else if (*begin == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,ot::commissioner::coap::OptionType>&>
                             (begin,"",&local_68);
        }
        begin = pcVar6;
      } while (pcVar6 != "");
      local_68._0_8_ = &local_ca;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)::fmt::v10::detail::
                   value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
                   format_custom_arg<ot::commissioner::coap::OptionType,fmt::v10::formatter<ot::commissioner::coap::OptionType,char,void>>
      ;
      fmt.size_ = 0xf;
      fmt.data_ = (char *)0x16;
      args.field_1.values_ = aVar12.values_;
      args.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_(&local_b0,(v10 *)"option {} is not valid",fmt,args);
      local_90 = kInvalidArgs;
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,local_b0._M_dataplus._M_p,
                 local_b0._M_dataplus._M_p + local_b0._M_string_length);
      pEVar16->mCode = local_90;
      std::__cxx11::string::operator=(local_c0,(string *)local_88);
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    return pEVar16;
  }
LAB_001d380b:
  abort();
}

Assistant:

Error Message::Serialize(OptionType         aOptionNumber,
                         const OptionValue &aOptionValue,
                         uint16_t           aLastOptionNumber,
                         ByteArray         &aBuf) const
{
    Error    error;
    uint16_t delta = utils::to_underlying(aOptionNumber) - aLastOptionNumber;
    uint16_t length;
    uint16_t valueLength = aOptionValue.GetLength();
    size_t   firstByte   = aBuf.size();
    size_t   extend      = aBuf.size() + 1;

    VerifyOrDie(utils::to_underlying(aOptionNumber) >= aLastOptionNumber);

    VerifyOrExit(IsValidOption(aOptionNumber, aOptionValue),
                 error = ERROR_INVALID_ARGS("option {} is not valid", aOptionNumber));

    length = 1;
    length += delta < kOption1ByteExtension ? 0 : (delta < kOption2ByteExtension ? 1 : 2);
    length += valueLength < kOption1ByteExtension ? 0 : (valueLength < kOption2ByteExtension ? 1 : 2);

    aBuf.resize(aBuf.size() + length);

    if (delta < kOption1ByteExtensionOffset)
    {
        aBuf[firstByte] = (delta << kOptionDeltaOffset) & kOptionDeltaMask;
    }
    else if (delta < kOption2ByteExtensionOffset)
    {
        aBuf[firstByte] |= kOption1ByteExtension << kOptionDeltaOffset;
        aBuf[extend++] = (delta - kOption1ByteExtensionOffset) & 0xff;
    }
    else
    {
        aBuf[firstByte] |= kOption2ByteExtension << kOptionDeltaOffset;
        delta -= kOption2ByteExtensionOffset;
        aBuf[extend++] = delta >> 8;
        aBuf[extend++] = delta & 0xff;
    }

    // Insert option length.
    if (valueLength < kOption1ByteExtensionOffset)
    {
        aBuf[firstByte] |= static_cast<uint8_t>(valueLength);
    }
    else if (valueLength < kOption2ByteExtensionOffset)
    {
        aBuf[firstByte] |= kOption1ByteExtension;
        aBuf[extend++] = (valueLength - kOption1ByteExtensionOffset) & 0xff;
    }
    else
    {
        uint16_t deltaLength = valueLength - kOption2ByteExtensionOffset;
        aBuf[firstByte] |= kOption2ByteExtension;
        aBuf[extend++] = deltaLength >> 8;
        aBuf[extend++] = deltaLength & 0xff;
    }

    VerifyOrDie(length + firstByte == extend);

    aBuf.insert(aBuf.end(), aOptionValue.GetOpaqueValue().begin(), aOptionValue.GetOpaqueValue().end());

exit:
    return error;
}